

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

void hash_table_display(hash_table_t *h,int32 showdisplay)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  char *__format;
  hash_entry_s *phVar4;
  long lVar5;
  
  puts("Hash with chaining representation of the hash table");
  if (h->size < 1) {
    uVar2 = 0;
  }
  else {
    pcVar1 = "%p";
    if (showdisplay != 0) {
      pcVar1 = "%s";
    }
    lVar5 = 0;
    uVar2 = 0;
    do {
      if (h->table[lVar5].key != (char *)0x0) {
        phVar4 = h->table + lVar5;
        printf("|key:");
        pcVar3 = phVar4->key;
        __format = pcVar1;
        do {
          printf(__format,pcVar3);
          do {
            printf("|len:%zd|val=%ld|->",phVar4->len,phVar4->val);
            if (phVar4->next == (hash_entry_s *)0x0) {
              puts("NULL");
            }
            uVar2 = uVar2 + 1;
            phVar4 = phVar4->next;
            if (phVar4 == (hash_entry_s *)0x0) goto LAB_001084fb;
            printf("|key:");
          } while (showdisplay == 0);
          pcVar3 = phVar4->key;
          __format = "%s";
        } while( true );
      }
LAB_001084fb:
      lVar5 = lVar5 + 1;
    } while (lVar5 < h->size);
  }
  printf("The total number of keys =%d\n",(ulong)uVar2);
  return;
}

Assistant:

void
hash_table_display(hash_table_t * h, int32 showdisplay)
{
    hash_entry_t *e;
    int i, j;
    j = 0;

    printf("Hash with chaining representation of the hash table\n");

    for (i = 0; i < h->size; i++) {
        e = &(h->table[i]);
        if (e->key != NULL) {
            printf("|key:");
            if (showdisplay)
                printf("%s", e->key);
            else
                printf("%p", e->key);

            printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
            if (e->next == NULL) {
                printf("NULL\n");
            }
            j++;

            for (e = e->next; e; e = e->next) {
                printf("|key:");
                if (showdisplay)
                    printf("%s", e->key);

                printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
                if (e->next == NULL) {
                    printf("NULL\n");
                }
                j++;
            }
        }
    }

    printf("The total number of keys =%d\n", j);
}